

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast_pybind_kukakr5arc.cpp
# Opt level: O2

PyObject * PyInit_ikfast_kukakr5arc(void)

{
  cpp_function cVar1;
  module mVar2;
  int iVar3;
  char *__s1;
  function_record *pfVar4;
  cpp_function func;
  module m;
  cpp_function func_1;
  cpp_function func_2;
  object local_58;
  object local_50;
  object local_48;
  object local_40;
  handle local_38;
  object local_30;
  
  __s1 = (char *)Py_GetVersion();
  iVar3 = strncmp(__s1,"3.10",4);
  if ((iVar3 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::module::module(&m,"ikfast_kukakr5arc",(char *)0x0);
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&func_2,
               (char (*) [215])
               "\n        ikfast_pybind_kukakr5arc\n        -----------------------\n        .. currentmodule:: ikfast_pybind_kukakr5arc\n        .. autosummary::\n           :toctree: _generate\n           get_ik\n           get_fk\n    "
              );
    pybind11::object::~object(&local_58);
    func_2.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_28a69;
    func_1.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_28a82;
    local_50.super_handle.m_ptr = (handle)(PyObject *)0x1381b6;
    local_30.super_handle.m_ptr = (handle)(handle)m.super_object.super_handle.m_ptr;
    local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&local_48,(handle)m.super_object.super_handle.m_ptr,"get_ik",
                      (PyObject *)&_Py_NoneStruct);
    local_38 = local_48.super_handle.m_ptr;
    func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&func);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_0,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,char[68]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_0&&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>(*)(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,char_const(&)[68])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pybind11::detail::
    process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_char[68]>
    ::init((EVP_PKEY_CTX *)&local_50);
    pybind11::cpp_function::initialize_generic
              (&func,pfVar4,"({List[float]}, {List[List[float]]}) -> List[List[float]]",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_0,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,char[68]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_0&&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>(*)(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,char_const&[])
                ::types,2);
    pybind11::object::~object(&local_48);
    pybind11::object::~object(&local_40);
    pybind11::module::add_object
              (&m,"get_ik",(handle)func.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func);
    mVar2 = m;
    func_2.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_28abf;
    local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&func,(handle)m.super_object.super_handle.m_ptr,"get_fk",
                      (PyObject *)&_Py_NoneStruct);
    cVar1 = func;
    func_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&func_1);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_1,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[64]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_1&&,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>(*)(std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[64])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar4->name = "get_fk";
    (pfVar4->scope).m_ptr = (PyObject *)mVar2.super_object.super_handle.m_ptr;
    (pfVar4->sibling).m_ptr = (PyObject *)cVar1.super_function.super_object.super_handle.m_ptr;
    pybind11::detail::process_attribute<pybind11::arg,_void>::init
              ((process_attribute<pybind11::arg,_void> *)&func_2,(EVP_PKEY_CTX *)pfVar4);
    pfVar4->doc = "\n        get forward kinematic solutions for kuka_kr6_r900\n    ";
    pybind11::cpp_function::initialize_generic
              (&func_1,pfVar4,"({List[float]}) -> Tuple[List[float], List[List[float]]]",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_1,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[64]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_1&&,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>(*)(std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
                ::types,1);
    pybind11::object::~object((object *)&func);
    pybind11::object::~object(&local_50);
    pybind11::module::add_object
              (&m,"get_fk",(handle)func_1.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func_1);
    mVar2 = m;
    func.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&func_1,(handle)m.super_object.super_handle.m_ptr,"get_dof",
                      (PyObject *)&_Py_NoneStruct);
    cVar1 = func_1;
    func_2.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&func_2);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_2,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[63]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_2&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[63])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar4->name = "get_dof";
    (pfVar4->scope).m_ptr = (PyObject *)mVar2.super_object.super_handle.m_ptr;
    (pfVar4->sibling).m_ptr = (PyObject *)cVar1.super_function.super_object.super_handle.m_ptr;
    pfVar4->doc = "\n        get number dofs configured for the ikfast module\n    ";
    pybind11::cpp_function::initialize_generic
              (&func_2,pfVar4,"() -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_2,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[63]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_2&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,0);
    pybind11::object::~object((object *)&func_1);
    pybind11::object::~object((object *)&func);
    pybind11::module::add_object
              (&m,"get_dof",(handle)func_2.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func_2);
    mVar2 = m;
    func.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&func_1,(handle)m.super_object.super_handle.m_ptr,"get_free_dof",
                      (PyObject *)&_Py_NoneStruct);
    cVar1 = func_1;
    func_2.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&func_2);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_3,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[71]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_3&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[71])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar4->name = "get_free_dof";
    (pfVar4->scope).m_ptr = (PyObject *)mVar2.super_object.super_handle.m_ptr;
    (pfVar4->sibling).m_ptr = (PyObject *)cVar1.super_function.super_object.super_handle.m_ptr;
    pfVar4->doc = "\n        get number of free dofs configured for the ikfast module\n    ";
    pybind11::cpp_function::initialize_generic
              (&func_2,pfVar4,"() -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_3,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[71]>(pybind11_init_ikfast_kukakr5arc(pybind11::module&)::$_3&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,0);
    pybind11::object::~object((object *)&func_1);
    pybind11::object::~object((object *)&func);
    pybind11::module::add_object
              (&m,"get_free_dof",(handle)func_2.super_function.super_object.super_handle.m_ptr,true)
    ;
    pybind11::object::~object((object *)&func_2);
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&func_2,
               (char (*) [4])"dev");
    pybind11::object::~object(&local_58);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(ikfast_kukakr5arc, m)
{
    m.doc() = R"pbdoc(
        ikfast_pybind_kukakr5arc
        -----------------------
        .. currentmodule:: ikfast_pybind_kukakr5arc
        .. autosummary::
           :toctree: _generate
           get_ik
           get_fk
    )pbdoc";

    m.def("get_ik", [](const std::vector<double> &trans_list,
                       const std::vector<std::vector<double>> &rot_list)
    {
      using namespace ikfast;
      IkSolutionList<double> solutions;

      std::vector<double> vfree(GetNumFreeParameters());
      double eerot[9], eetrans[3];

      for(std::size_t i = 0; i < 3; ++i)
      {
          eetrans[i] = trans_list[i];
          std::vector<double> rot_vec = rot_list[i];
          for(std::size_t j = 0; j < 3; ++j)
          {
              eerot[3*i + j] = rot_vec[j];
          }
      }

      // call ikfast routine
      bool b_success = ComputeIk(eetrans, eerot, &vfree[0], solutions);

      std::vector<std::vector<double>> solution_list;
      if (!b_success)
      {
          //fprintf(stderr,"Failed to get ik solution\n");
          return solution_list; // Equivalent to returning None in python
      }

      std::vector<double> solvalues(GetNumJoints());

      // convert all ikfast solutions into a std::vector
      for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i)
      {
          const IkSolutionBase<double>& sol = solutions.GetSolution(i);
          std::vector<double> vsolfree(sol.GetFree().size());
          sol.GetSolution(&solvalues[0],
                          vsolfree.size() > 0 ? &vsolfree[0] : NULL);

          std::vector<double> individual_solution = std::vector<double>(GetNumJoints());
          for(std::size_t j = 0; j < solvalues.size(); ++j)
          {
              individual_solution[j] = solvalues[j];
          }
          solution_list.push_back(individual_solution);
      }
      return solution_list;
    },
    py::arg("trans_list"),
    py::arg("rot_list"),
    R"pbdoc(
        get inverse kinematic solutions for pybind_kukakr5arc
    )pbdoc");

    m.def("get_fk", [](const std::vector<double> &joint_list)
    {
      using namespace ikfast;
      // eerot is a flattened 3x3 rotation matrix
      double eerot[9], eetrans[3];

      std::vector<double> joints(GetNumJoints());
      for(std::size_t i = 0; i < GetNumJoints(); ++i)
      {
          joints[i] = joint_list[i];
      }

      // call ikfast routine
      ComputeFk(&joints[0], eetrans, eerot);

      // convert computed EE pose to a python object
      std::vector<double> pos(3);
      std::vector<std::vector<double>> rot(3);

      for(std::size_t i = 0; i < 3; ++i)
      {
          pos[i] = eetrans[i];
          std::vector<double> rot_vec(3);
          for( std::size_t j = 0; j < 3; ++j)
          {
              rot_vec[j] = eerot[3*i + j];
          }
          rot[i] = rot_vec;
      }
      return std::make_tuple(pos, rot);
    },
    py::arg("joint_list"),
    R"pbdoc(
        get forward kinematic solutions for kuka_kr6_r900
    )pbdoc");

    m.def("get_dof", []()
    {
      return int(GetNumJoints());
    },
    R"pbdoc(
        get number dofs configured for the ikfast module
    )pbdoc");

    m.def("get_free_dof", []()
    {
      return int(GetNumFreeParameters());
    },
    R"pbdoc(
        get number of free dofs configured for the ikfast module
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = VERSION_INFO;
#else
    m.attr("__version__") = "dev";
#endif

}